

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
* deqp::gles31::Functional::NegativeTestShared::getNegativeShaderFunctionTestFunctions(void)

{
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>>
  *in_RDI;
  FunctionContainer funcs [69];
  allocator_type local_689;
  FunctionContainer local_688 [69];
  
  memcpy(local_688,&PTR_bitfield_extract_invalid_value_type_0216f680,0x678);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>>
  ::vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer_const*,void>
            (in_RDI,local_688,(FunctionContainer *)&stack0xfffffffffffffff0,&local_689);
  return (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
          *)in_RDI;
}

Assistant:

std::vector<FunctionContainer> getNegativeShaderFunctionTestFunctions ()
{
	const FunctionContainer funcs[] =
	{
		{bitfield_extract_invalid_value_type,				"bitfield_extract_invalid_value_type",				"Invalid usage of bitfieldExtract."			},
		{bitfield_extract_invalid_offset_type,				"bitfield_extract_invalid_offset_type",				"Invalid usage of bitfieldExtract."			},
		{bitfield_extract_invalid_bits_type,				"bitfield_extract_invalid_bits_type",				"Invalid usage of bitfieldExtract."			},
		{bitfield_insert_invalid_base_type,					"bitfield_insert_invalid_base_type",				"Invalid usage of bitfieldInsert."			},
		{bitfield_insert_invalid_insert_type,				"bitfield_insert_invalid_insert_type",				"Invalid usage of bitfieldInsert."			},
		{bitfield_insert_invalid_offset_type,				"bitfield_insert_invalid_offset_type",				"Invalid usage of bitfieldInsert."			},
		{bitfield_insert_invalid_bits_type,					"bitfield_insert_invalid_bits_type",				"Invalid usage of bitfieldInsert."			},
		{bitfield_reverse,									"bitfield_reverse",									"Invalid usage of bitfieldReverse."			},
		{bit_count,											"bit_count",										"Invalid usage of bitCount."				},
		{find_msb,											"find_msb",											"Invalid usage of findMSB."					},
		{find_lsb,											"find_lsb",											"Invalid usage of findLSB."					},
		{uadd_carry_invalid_x,								"uadd_carry_invalid_x",								"Invalid usage of uaddCarry."				},
		{uadd_carry_invalid_y,								"uadd_carry_invalid_y",								"Invalid usage of uaddCarry."				},
		{uadd_carry_invalid_carry,							"uadd_carry_invalid_carry",							"Invalid usage of uaddCarry."				},
		{usub_borrow_invalid_x,								"usub_borrow_invalid_x",							"Invalid usage of usubBorrow."				},
		{usub_borrow_invalid_y,								"usub_borrow_invalid_y",							"Invalid usage of usubBorrow."				},
		{usub_borrow_invalid_borrow,						"usub_borrow_invalid_borrow",						"Invalid usage of usubBorrow."				},
		{umul_extended_invalid_x,							"umul_extended_invalid_x",							"Invalid usage of umulExtended."			},
		{umul_extended_invalid_y,							"umul_extended_invalid_y",							"Invalid usage of umulExtended."			},
		{umul_extended_invalid_msb,							"umul_extended_invalid_msb",						"Invalid usage of umulExtended."			},
		{umul_extended_invalid_lsb,							"umul_extended_invalid_lsb",						"Invalid usage of umulExtended."			},
		{imul_extended_invalid_x,							"imul_extended_invalid_x",							"Invalid usage of imulExtended."			},
		{imul_extended_invalid_y,							"imul_extended_invalid_y",							"Invalid usage of imulExtended."			},
		{imul_extended_invalid_msb,							"imul_extended_invalid_msb",						"Invalid usage of imulExtended."			},
		{imul_extended_invalid_lsb,							"imul_extended_invalid_lsb",						"Invalid usage of imulExtended."			},
		{frexp_invalid_x,									"frexp_invalid_x",									"Invalid usage of frexp."					},
		{frexp_invalid_exp,									"frexp_invalid_exp",								"Invalid usage of frexp."					},
		{ldexp_invalid_x,									"ldexp_invalid_x",									"Invalid usage of ldexp."					},
		{ldexp_invalid_exp,									"ldexp_invalid_exp",								"Invalid usage of ldexp."					},
		{pack_unorm_4x8,									"pack_unorm_4x8",									"Invalid usage of packUnorm4x8."			},
		{pack_snorm_4x8,									"pack_snorm_4x8",									"Invalid usage of packSnorm4x8."			},
		{unpack_snorm_4x8,									"unpack_snorm_4x8",									"Invalid usage of unpackSnorm4x8."			},
		{unpack_unorm_4x8,									"unpack_unorm_4x8",									"Invalid usage of unpackUnorm4x8."			},
		{texture_size_invalid_sampler,						"texture_size_invalid_sampler",						"Invalid usage of textureSize."				},
		{texture_size_invalid_lod,							"texture_size_invalid_lod",							"Invalid usage of textureSize."				},
		{texture_invalid_p,									"texture_invalid_p",								"Invalid usage of texture."					},
		{texture_invalid_bias_or_compare,					"texture_invalid_bias_or_compare",					"Invalid usage of texture."					},
		{texture_lod_invalid_p,								"texture_lod_invalid_p",							"Invalid usage of textureLod."				},
		{texture_lod_invalid_lod,							"texture_lod_invalid_lod",							"Invalid usage of textureLod."				},
		{texel_fetch_invalid_p,								"texel_fetch_invalid_p",							"Invalid usage of texelFetch."				},
		{texel_fetch_invalid_sample,						"texel_fetch_invalid_sample",						"Invalid usage of texelFetch."				},
		{emit_vertex,										"emit_vertex",										"Invalid usage of EmitVertex."				},
		{end_primitive,										"end_primitive",									"Invalid usage of EndPrimitive."			},
		{texture_grad,										"texture_grad",										"Invalid usage of textureGrad."				},
		{texture_gather_sampler_2d,							"texture_gather_sampler_2d",						"Invalid usage of textureGather."			},
		{texture_gather_sampler_2d_array,					"texture_gather_sampler_2d_array",					"Invalid usage of textureGather."			},
		{texture_gather_sampler_cube,						"texture_gather_sampler_cube",						"Invalid usage of textureGather."			},
		{texture_gather_sampler_2d_shadow,					"texture_gather_sampler_2d_shadow",					"Invalid usage of textureGather."			},
		{texture_gather_sampler_2d_array_shadow,			"texture_gather_sampler_2d_array_shadow",			"Invalid usage of textureGather."			},
		{texture_gather_sampler_cube_shadow,				"texture_gather_sampler_cube_shadow",				"Invalid usage of textureGather."			},
		{texture_gather_sampler_cube_array,					"texture_gather_sampler_cube_array",				"Invalid usage of textureGather."			},
		{texture_gather_sampler_cube_array_shadow,			"texture_gather_sampler_cube_array_shadow",			"Invalid usage of textureGather."			},
		{texture_gather_offset_sampler_2d,					"texture_gather_offset_sampler_2d",					"Invalid usage of textureGatherOffset."		},
		{texture_gather_offset_sampler_2d_array,			"texture_gather_offset_sampler_2d_array",			"Invalid usage of textureGatherOffset."		},
		{texture_gather_offset_sampler_2d_shadow,			"texture_gather_offset_sampler_2d_shadow",			"Invalid usage of textureGatherOffset."		},
		{texture_gather_offset_sampler_2d_array_shadow,		"texture_gather_offset_sampler_2d_array_shadow",	"Invalid usage of textureGatherOffset."		},
		{texture_gather_offsets,							"texture_gather_offsets",							"Invalid usage of textureGatherOffsets."	},
		{atomic_add,										"atomic_add",										"Invalid usage of atomicAdd."				},
		{atomic_min,										"atomic_min",										"Invalid usage of atomicMin."				},
		{atomic_max,										"atomic_max",										"Invalid usage of atomicMax."				},
		{atomic_and,										"atomic_and",										"Invalid usage of atomicAnd."				},
		{atomic_or,											"atomic_or",										"Invalid usage of atomicOr."				},
		{atomic_xor,										"atomic_xor",										"Invalid usage of atomicXor."				},
		{atomic_exchange,									"atomic_exchange",									"Invalid usage of atomicExchange."			},
		{atomic_comp_swap,									"atomic_comp_swap",									"Invalid usage of atomicCompSwap."			},
		{interpolate_at_centroid,							"interpolate_at_centroid",							"Invalid usage of interpolateAtCentroid."	},
		{interpolate_at_sample,								"interpolate_at_sample",							"Invalid usage of interpolateAtSample."		},
		{interpolate_at_offset,								"interpolate_at_offset",							"Invalid usage of interpolateAtOffset."		},
		{fma,												"fma",												"Invalid usage of fma."						},
	};

	return std::vector<FunctionContainer>(DE_ARRAY_BEGIN(funcs), DE_ARRAY_END(funcs));
}